

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Connection *c)

{
  (*this->_vptr_ASTVisitor[3])(this,(c->source->endpoint).object);
  (*this->_vptr_ASTVisitor[3])(this,(c->dest->endpoint).object);
  if ((c->delayLength).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
    return;
  }
  return;
}

Assistant:

virtual void visit (AST::Connection& c)
    {
        visitObject (c.source.endpoint);
        visitObject (c.dest.endpoint);
        visitObjectIfNotNull (c.delayLength);
    }